

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O2

RegEx * YAML::Exp::EndScalarInFlow(void)

{
  int iVar1;
  RegEx *ex1;
  allocator local_12a;
  allocator local_129;
  string local_128;
  RegEx local_108;
  string local_e8;
  RegEx local_c8;
  RegEx local_a8;
  RegEx local_88;
  RegEx local_68;
  RegEx local_48;
  RegEx local_28;
  
  if (EndScalarInFlow()::e == '\0') {
    iVar1 = __cxa_guard_acquire(&EndScalarInFlow()::e);
    if (iVar1 != 0) {
      RegEx::RegEx(&local_48,':');
      ex1 = BlankOrBreak();
      RegEx::RegEx(&local_a8);
      operator|(&local_88,ex1,&local_a8);
      std::__cxx11::string::string((string *)&local_e8,",]}",&local_129);
      RegEx::RegEx(&local_c8,&local_e8,REGEX_OR);
      operator|(&local_68,&local_88,&local_c8);
      operator+(&local_28,&local_48,&local_68);
      std::__cxx11::string::string((string *)&local_128,",?[]{}",&local_12a);
      RegEx::RegEx(&local_108,&local_128,REGEX_OR);
      operator|(&EndScalarInFlow::e,&local_28,&local_108);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_108.m_params);
      std::__cxx11::string::~string((string *)&local_128);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_28.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_68.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_c8.m_params);
      std::__cxx11::string::~string((string *)&local_e8);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_88.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_a8.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_48.m_params);
      __cxa_atexit(RegEx::~RegEx,&EndScalarInFlow::e,&__dso_handle);
      __cxa_guard_release(&EndScalarInFlow()::e);
    }
  }
  return &EndScalarInFlow::e;
}

Assistant:

inline const RegEx& EndScalarInFlow() {
  static const RegEx e =
      (RegEx(':') + (BlankOrBreak() | RegEx() | RegEx(",]}", REGEX_OR))) |
      RegEx(",?[]{}", REGEX_OR);
  return e;
}